

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O1

string * __thiscall
absl::lts_20240722::StrCat<std::__cxx11::string,char[179]>
          (string *__return_storage_ptr__,lts_20240722 *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,
          AlphaNum *d,AlphaNum *e,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [179])

{
  undefined8 local_88;
  undefined8 uStack_80;
  size_t local_78;
  char *pcStack_70;
  size_t local_68;
  char *pcStack_60;
  size_t local_58;
  char *pcStack_50;
  size_t local_48;
  char *pcStack_40;
  char *local_38;
  size_t local_30;
  size_t local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  local_88 = *(undefined8 *)this;
  uStack_80 = *(undefined8 *)(this + 8);
  local_78 = (a->piece_)._M_len;
  pcStack_70 = (a->piece_)._M_str;
  local_68 = (b->piece_)._M_len;
  pcStack_60 = (b->piece_)._M_str;
  local_58 = (c->piece_)._M_len;
  pcStack_50 = (c->piece_)._M_str;
  local_48 = (d->piece_)._M_len;
  pcStack_40 = (d->piece_)._M_str;
  local_30 = (e->piece_)._M_len;
  local_38 = (e->piece_)._M_str;
  local_28 = strlen((char *)args);
  local_20 = args;
  absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(__return_storage_ptr__,&local_88,7);
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string StrCat(
    const AlphaNum& a, const AlphaNum& b, const AlphaNum& c, const AlphaNum& d,
    const AlphaNum& e, const AV&... args) {
  return strings_internal::CatPieces(
      {a.Piece(), b.Piece(), c.Piece(), d.Piece(), e.Piece(),
       static_cast<const AlphaNum&>(args).Piece()...});
}